

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pthreads_summator_lib.cpp
# Opt level: O0

void * thread(void *thread_data)

{
  code *pcVar1;
  int *piVar2;
  byte bVar3;
  ostream *poVar4;
  int local_3fc;
  string local_3f8 [4];
  int num;
  string local_3d8 [32];
  istream local_3b8 [8];
  ifstream in;
  thr_data *data;
  stringstream ss;
  ostream local_188 [376];
  int *local_10;
  void *thread_data_local;
  
  local_10 = (int *)thread_data;
  std::__cxx11::stringstream::stringstream((stringstream *)&data);
  piVar2 = local_10;
  poVar4 = std::operator<<(local_188,"..\\Files\\");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,*piVar2);
  std::operator<<(poVar4,".txt");
  std::__cxx11::stringstream::str();
  std::ifstream::ifstream(local_3b8,local_3d8,8);
  std::__cxx11::string::~string(local_3d8);
  std::__cxx11::string::string(local_3f8);
  std::__cxx11::stringstream::str((string *)&data);
  std::__cxx11::string::~string(local_3f8);
  bVar3 = std::ifstream::is_open();
  if ((bVar3 & 1) != 0) {
    while (bVar3 = std::ios::eof(), ((bVar3 ^ 0xff) & 1) != 0) {
      std::istream::operator>>(local_3b8,&local_3fc);
      *(long *)(piVar2 + 2) = (long)local_3fc + *(long *)(piVar2 + 2);
    }
  }
  std::ifstream::close();
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void* thread(void *thread_data) {
    stringstream ss;
    thr_data *data = (thr_data*) thread_data;

    ss << "..\\Files\\" << data->numberFile << ".txt";
    ifstream in(ss.str());
    ss.str(string());
    if (in.is_open()) {
        while (!in.eof()) {
            int num;
            in >> num;
            data->sum += num;
        }
    }
    in.close();
}